

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

void __thiscall TreeIncPruneBGPlanner::Initialize(TreeIncPruneBGPlanner *this)

{
  void *pvVar1;
  AlphaVectorPlanning *this_00;
  size_t sVar2;
  long in_RDI;
  pair<long,_long> pVar3;
  AlphaVectorPlanning *in_stack_00000520;
  AlphaVectorPlanning *in_stack_ffffffffffffff38;
  index in_stack_ffffffffffffff58;
  extent_gen<0UL> *in_stack_ffffffffffffff60;
  
  AlphaVectorPlanning::Initialize(in_stack_00000520);
  pvVar1 = operator_new(0xa0);
  AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff38);
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x94242b);
  pVar3 = (pair<long,_long>)
          boost::detail::multi_array::extent_gen<0UL>::operator[]
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff38);
  PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x94247e);
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<1UL> *)pVar3.first,pVar3.second);
  AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff38);
  this_00 = (AlphaVectorPlanning *)
            PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x9424b6);
  boost::detail::multi_array::extent_gen<2UL>::operator[]
            ((extent_gen<2UL> *)pVar3.first,pVar3.second);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 *)pVar3.first,(extent_gen<3UL> *)pVar3.second);
  *(void **)(in_RDI + 400) = pvVar1;
  AlphaVectorPlanning::GetPU(this_00);
  sVar2 = PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x942506);
  *(int *)(in_RDI + 0x210) = (int)sVar2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
           *)0x94251d);
  *(undefined1 *)(in_RDI + 0x150) = 1;
  return;
}

Assistant:

void TreeIncPruneBGPlanner::Initialize()
{
    AlphaVectorPlanning::Initialize();

    _m_Gaoa=new GaobetaVectorSet(boost::extents[GetPU()->GetNrJointActions()]
                                 [GetPU()->GetNrJointObservations()]
                                 [GetPU()->GetNrJointActions()]);

    _m_maxDepth=GetPU()->GetNrJointObservations();
    _m_vectorSetCache.clear();

    MonahanPlanner::_m_initialized=true;
}